

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::visitStructRMW(OptimizeInstructions *this,StructRMW *curr)

{
  AtomicRMWOp AVar1;
  Index IVar2;
  Index index;
  bool bVar3;
  bool bVar4;
  BinaryOp op;
  Module *wasm;
  int64_t iVar5;
  Drop *second;
  Expression *pEVar6;
  Function *pFVar7;
  LocalGet *pLVar8;
  StructGet *pSVar9;
  LocalGet *right;
  ExpressionList *pEVar10;
  StructSet *item;
  optional<wasm::Type> type;
  Op local_134;
  Op binop;
  Binary *local_128;
  Expression *newVal;
  optional<wasm::Type> local_118;
  uintptr_t local_108;
  uintptr_t local_100;
  LocalSet *local_f8;
  LocalSet *local_f0;
  LocalSet *local_e8;
  initializer_list<wasm::Expression_*> local_e0;
  Block *local_d0;
  Block *block;
  Index local_bc;
  Type TStack_b8;
  Index result;
  Index local_ac;
  Type TStack_a8;
  Index val;
  Index local_9c;
  HeapType HStack_98;
  Index ref;
  uint local_8c;
  uintptr_t local_88;
  char *local_80;
  Literal local_78;
  byte local_49;
  undefined1 local_48 [7];
  bool canOptimize;
  Literal val_1;
  Expression *value;
  Builder builder;
  StructRMW *curr_local;
  OptimizeInstructions *this_local;
  
  skipNonNullCast(this,&curr->ref,(Expression *)curr);
  bVar3 = trapOnNull(this,(Expression *)curr,&curr->ref);
  if (bVar3) {
    return;
  }
  bVar3 = wasm::Type::isStruct(&curr->ref->type);
  if (!bVar3) {
    return;
  }
  builder.wasm = (Module *)wasm::Type::getHeapType(&curr->ref->type);
  bVar4 = HeapType::isShared((HeapType *)&builder);
  bVar3 = false;
  if (bVar4) {
    bVar3 = curr->order == SeqCst;
  }
  if (bVar3) {
    return;
  }
  wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
         getModule(&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                    ).
                    super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    .
                    super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  );
  Builder::Builder((Builder *)&value,wasm);
  val_1.type.id = (uintptr_t)getFallthrough(this,curr->value);
  bVar3 = Properties::isSingleConstantExpression((Expression *)val_1.type.id);
  if (!bVar3) goto LAB_01f7a096;
  Properties::getLiteral((Literal *)local_48,(Expression *)val_1.type.id);
  local_49 = 0;
  AVar1 = curr->op;
  if (AVar1 < RMWAnd) {
LAB_01f79f19:
    iVar5 = wasm::Literal::getInteger((Literal *)local_48);
    local_49 = iVar5 == 0;
  }
  else if (AVar1 == RMWAnd) {
    local_80 = val_1.field_0.func.super_IString.str._M_str;
    wasm::Literal::makeNegOne
              (&local_78,
               (Type)val_1.field_0.gcData.
                     super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
    local_49 = wasm::Literal::operator==((Literal *)local_48,&local_78);
    wasm::Literal::~Literal(&local_78);
  }
  else {
    if (AVar1 - RMWOr < 2) goto LAB_01f79f19;
    if (AVar1 == RMWXchg) {
      local_49 = 0;
    }
  }
  bVar3 = (local_49 & 1) != 0;
  if (bVar3) {
    IVar2 = curr->index;
    pEVar6 = curr->ref;
    second = Builder::makeDrop((Builder *)&value,curr->value);
    pEVar6 = getResultOfFirst(this,pEVar6,(Expression *)second);
    local_88 = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
    pSVar9 = Builder::makeStructGet((Builder *)&value,IVar2,pEVar6,curr->order,(Type)local_88,false)
    ;
    replaceCurrent(this,(Expression *)pSVar9);
  }
  local_8c = (uint)bVar3;
  wasm::Literal::~Literal((Literal *)local_48);
  if (local_8c != 0) {
    return;
  }
LAB_01f7a096:
  HStack_98 = wasm::Type::getHeapType(&curr->ref->type);
  bVar3 = HeapType::isShared(&stack0xffffffffffffff68);
  if (!bVar3) {
    pFVar7 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                          ).
                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .
                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        );
    TStack_a8.id = (curr->ref->type).id;
    local_9c = Builder::addVar(pFVar7,TStack_a8);
    pFVar7 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                          ).
                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .
                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        );
    TStack_b8.id = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.
                   id;
    local_ac = Builder::addVar(pFVar7,TStack_b8);
    pFVar7 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                          ).
                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .
                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        );
    block = (Block *)(curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.
                     type.id;
    local_bc = Builder::addVar(pFVar7,(Type)block);
    local_f8 = Builder::makeLocalSet((Builder *)&value,local_9c,curr->ref);
    local_f0 = Builder::makeLocalSet((Builder *)&value,local_ac,curr->value);
    index = local_bc;
    IVar2 = curr->index;
    local_100 = (curr->ref->type).id;
    pLVar8 = Builder::makeLocalGet((Builder *)&value,local_9c,(Type)local_100);
    local_108 = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
    pSVar9 = Builder::makeStructGet
                       ((Builder *)&value,IVar2,(Expression *)pLVar8,Unordered,(Type)local_108,false
                       );
    local_e8 = Builder::makeLocalSet((Builder *)&value,index,(Expression *)pSVar9);
    local_e0._M_array = (iterator)&local_f8;
    local_e0._M_len = 3;
    std::optional<wasm::Type>::optional(&local_118);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_118.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_118.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    local_d0 = Builder::makeBlock((Builder *)&value,&local_e0,type);
    if (curr->op == RMWXchg) {
      local_128 = (Binary *)
                  Builder::makeLocalGet
                            ((Builder *)&value,local_ac,
                             (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)68>).
                                   super_Expression.type.id);
    }
    else {
      local_134 = Add;
      switch(curr->op) {
      case RMWAdd:
        local_134 = Add;
        break;
      case RMWSub:
        local_134 = Sub;
        break;
      case RMWAnd:
        local_134 = And;
        break;
      case RMWOr:
        local_134 = Or;
        break;
      case RMWXor:
        local_134 = Xor;
      }
      op = Abstract::getBinary((Type)(curr->super_SpecificExpression<(wasm::Expression::Id)68>).
                                     super_Expression.type.id,local_134);
      pLVar8 = Builder::makeLocalGet
                         ((Builder *)&value,local_bc,
                          (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)68>).
                                super_Expression.type.id);
      right = Builder::makeLocalGet
                        ((Builder *)&value,local_ac,
                         (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)68>).
                               super_Expression.type.id);
      local_128 = Builder::makeBinary((Builder *)&value,op,(Expression *)pLVar8,(Expression *)right)
      ;
    }
    pEVar10 = &local_d0->list;
    IVar2 = curr->index;
    pLVar8 = Builder::makeLocalGet((Builder *)&value,local_9c,(Type)(curr->ref->type).id);
    item = Builder::makeStructSet
                     ((Builder *)&value,IVar2,(Expression *)pLVar8,(Expression *)local_128,Unordered
                     );
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar10->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
    pEVar10 = &local_d0->list;
    pLVar8 = Builder::makeLocalGet
                       ((Builder *)&value,local_bc,
                        (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)68>).
                              super_Expression.type.id);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar10->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pLVar8);
    (local_d0->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
         (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
    replaceCurrent(this,(Expression *)local_d0);
  }
  return;
}

Assistant:

void visitStructRMW(StructRMW* curr) {
    skipNonNullCast(curr->ref, curr);
    if (trapOnNull(curr, curr->ref)) {
      return;
    }

    if (!curr->ref->type.isStruct()) {
      return;
    }

    // We generally can't optimize seqcst RMWs on shared memory because they can
    // act as both the source and sink of synchronization edges, even if they
    // don't modify the in-memory value.
    if (curr->ref->type.getHeapType().isShared() &&
        curr->order == MemoryOrder::SeqCst) {
      return;
    }

    Builder builder(*getModule());

    // This RMW is either to non-shared memory or has acquire-release ordering.
    // In the former case, it trivially does not synchronize with other threads
    // and we can optimize to our heart's content. In the latter case, if we
    // know the RMW does not change the value in memory, then we can consider
    // all subsequent reads as reading from the previous write rather than from
    // this RMW op, which means this RMW does not synchronize with later reads
    // and we can optimize out the write part. This optimization wouldn't be
    // valid for sequentially consistent RMW ops because the next reads from
    // this location in the total order of seqcst ops would have to be
    // considered to be reading from this RMW and therefore would synchronize
    // with it.
    auto* value = getFallthrough(curr->value);
    if (Properties::isSingleConstantExpression(value)) {
      auto val = Properties::getLiteral(value);
      bool canOptimize = false;
      switch (curr->op) {
        case RMWAdd:
        case RMWSub:
        case RMWOr:
        case RMWXor:
          canOptimize = val.getInteger() == 0;
          break;
        case RMWAnd:
          canOptimize = val == Literal::makeNegOne(val.type);
          break;
        case RMWXchg:
          canOptimize = false;
          break;
      }
      if (canOptimize) {
        replaceCurrent(builder.makeStructGet(
          curr->index,
          getResultOfFirst(curr->ref, builder.makeDrop(curr->value)),
          curr->order,
          curr->type));
        return;
      }
    }

    // No further optimizations possible on RMWs to shared memory.
    if (curr->ref->type.getHeapType().isShared()) {
      return;
    }

    // Lower the RMW to its more basic operations. Breaking the atomic
    // operation into several non-atomic operations is safe because no other
    // thread can observe an intermediate state in the unshared memory. This
    // initially increases code size, but the more basic operations may be
    // more optimizable than the original RMW.
    // TODO: Experiment to determine whether this is worthwhile on real code.
    // Maybe we should do this optimization only when optimizing for speed over
    // size.
    auto ref = builder.addVar(getFunction(), curr->ref->type);
    auto val = builder.addVar(getFunction(), curr->type);
    auto result = builder.addVar(getFunction(), curr->type);
    auto* block = builder.makeBlock(
      {builder.makeLocalSet(ref, curr->ref),
       builder.makeLocalSet(val, curr->value),
       builder.makeLocalSet(
         result,
         builder.makeStructGet(curr->index,
                               builder.makeLocalGet(ref, curr->ref->type),
                               MemoryOrder::Unordered,
                               curr->type))});
    Expression* newVal = nullptr;
    if (curr->op == RMWXchg) {
      newVal = builder.makeLocalGet(val, curr->type);
    } else {
      Abstract::Op binop = Abstract::Add;
      switch (curr->op) {
        case RMWAdd:
          binop = Abstract::Add;
          break;
        case RMWSub:
          binop = Abstract::Sub;
          break;
        case RMWAnd:
          binop = Abstract::And;
          break;
        case RMWOr:
          binop = Abstract::Or;
          break;
        case RMWXor:
          binop = Abstract::Xor;
          break;
        case RMWXchg:
          WASM_UNREACHABLE("unexpected op");
      }
      newVal = builder.makeBinary(Abstract::getBinary(curr->type, binop),
                                  builder.makeLocalGet(result, curr->type),
                                  builder.makeLocalGet(val, curr->type));
    }
    block->list.push_back(
      builder.makeStructSet(curr->index,
                            builder.makeLocalGet(ref, curr->ref->type),
                            newVal,
                            MemoryOrder::Unordered));

    block->list.push_back(builder.makeLocalGet(result, curr->type));
    block->type = curr->type;
    replaceCurrent(block);
  }